

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestNestedRequiredForeign::SharedDtor(MessageLite *self)

{
  MessageLite *pMVar1;
  TestRequiredEnum *this;
  TestRequiredEnumNoMask *this_00;
  TestRequiredEnumMulti *this_01;
  TestRequiredNoMaskMulti *this_02;
  ulong uVar2;
  undefined8 extraout_RAX;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pMVar1 = (MessageLite *)self[1]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageLite *)0x0) {
      SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x50);
    pMVar1 = (MessageLite *)self[2]._vptr_MessageLite;
    if (pMVar1 != (MessageLite *)0x0) {
      TestRequiredForeign::SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x48);
    this = (TestRequiredEnum *)self[2]._internal_metadata_.ptr_;
    if (this != (TestRequiredEnum *)0x0) {
      TestRequiredEnum::~TestRequiredEnum(this);
    }
    operator_delete(this,0x20);
    this_00 = (TestRequiredEnumNoMask *)self[3]._vptr_MessageLite;
    if (this_00 != (TestRequiredEnumNoMask *)0x0) {
      TestRequiredEnumNoMask::~TestRequiredEnumNoMask(this_00);
    }
    operator_delete(this_00,0x20);
    this_01 = (TestRequiredEnumMulti *)self[3]._internal_metadata_.ptr_;
    if (this_01 != (TestRequiredEnumMulti *)0x0) {
      TestRequiredEnumMulti::~TestRequiredEnumMulti(this_01);
    }
    operator_delete(this_01,0x28);
    this_02 = (TestRequiredNoMaskMulti *)self[4]._vptr_MessageLite;
    if (this_02 != (TestRequiredNoMaskMulti *)0x0) {
      TestRequiredNoMaskMulti::~TestRequiredNoMaskMulti(this_02);
    }
    operator_delete(this_02,0x38);
    return;
  }
  SharedDtor((TestNestedRequiredForeign *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void TestNestedRequiredForeign::SharedDtor(MessageLite& self) {
  TestNestedRequiredForeign& this_ = static_cast<TestNestedRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  delete this_._impl_.required_enum_;
  delete this_._impl_.required_enum_no_mask_;
  delete this_._impl_.required_enum_multi_;
  delete this_._impl_.required_no_mask_;
  this_._impl_.~Impl_();
}